

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> * __thiscall
soul::heart::Parser::
parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
          (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>
           *__return_storage_ptr__,Parser *this,FunctionParseState *state)

{
  bool bVar1;
  pool_ref<soul::heart::Expression> local_58;
  Expression *local_50;
  Expression *arg;
  char *local_30;
  undefined1 local_21;
  FunctionParseState *local_20;
  FunctionParseState *state_local;
  Parser *this_local;
  ArgListType *args;
  
  local_21 = 0;
  local_20 = state;
  state_local = (FunctionParseState *)this;
  this_local = (Parser *)__return_storage_ptr__;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::ArrayWithPreallocation
            (__return_storage_ptr__);
  local_30 = "(";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x573c42);
  if (bVar1) {
    arg = (Expression *)0x571824;
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x571824);
    if (!bVar1) {
      do {
        local_50 = parseExpression(this,local_20);
        pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>
                  (&local_58,local_50);
        ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
                  (__return_storage_ptr__,&local_58);
        pool_ref<soul::heart::Expression>::~pool_ref(&local_58);
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)",");
      } while (bVar1);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x571824);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ArgListType parseOptionalBranchArgs (const FunctionParseState& state)
    {
        heart::FunctionCall::ArgListType args;

        if (matchIf (HEARTOperator::openParen))
        {
            if (! matchIf (HEARTOperator::closeParen))
            {
                for (;;)
                {
                    auto& arg = parseExpression (state);
                    args.push_back (arg);

                    if (matchIf (HEARTOperator::comma))
                        continue;

                    expect (HEARTOperator::closeParen);
                    break;
                }
            }
        }

        return args;
    }